

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dfa.cc
# Opt level: O1

bool __thiscall
re2::Prog::SearchDFA
          (Prog *this,StringPiece *text,StringPiece *const_context,Anchor anchor,MatchKind kind,
          StringPiece *match0,bool *failed,vector<int,_std::allocator<int>_> *matches)

{
  undefined1 uVar1;
  char *pcVar2;
  bool bVar3;
  bool bVar4;
  int iVar5;
  DFA *this_00;
  char *pcVar6;
  MatchKind kind_00;
  byte bVar8;
  byte bVar9;
  StringPiece *pSVar10;
  StringPiece context;
  char *ep;
  StringPiece *local_38;
  long lVar7;
  
  *failed = false;
  context.ptr_ = const_context->ptr_;
  context.length_ = const_context->length_;
  context._12_4_ = *(undefined4 *)&const_context->field_0xc;
  if (context.ptr_ == (char *)0x0) {
    context.length_ = text->length_;
    context.ptr_ = text->ptr_;
  }
  uVar1 = this->anchor_start_;
  bVar4 = this->anchor_end_;
  bVar8 = uVar1;
  bVar9 = bVar4;
  if (this->reversed_ != false) {
    bVar8 = bVar4;
    bVar9 = uVar1;
  }
  if (((bVar8 == 1) && (context.ptr_ != text->ptr_)) ||
     ((bVar9 != 0 && (context.ptr_ + context.length_ != text->ptr_ + text->length_)))) {
    return false;
  }
  bVar3 = true;
  bVar9 = true;
  if (anchor != kAnchored) {
    bVar9 = kind == kFullMatch | uVar1;
  }
  if (kind != kFullMatch) {
    if (kind == kManyMatch) goto LAB_00132bc8;
    if (bVar4 == false) {
      bVar3 = false;
      goto LAB_00132bc8;
    }
  }
  kind = kLongestMatch;
LAB_00132bc8:
  kind_00 = kLongestMatch;
  if (bVar3) {
    kind_00 = kind;
  }
  if (match0 != (StringPiece *)0x0) {
    kind_00 = kind;
  }
  local_38 = match0;
  this_00 = GetDFA(this,kind_00);
  bVar4 = DFA::Search(this_00,text,&context,(bool)bVar9,
                      (bool)(match0 == (StringPiece *)0x0 & (bVar3 ^ 1U)),
                      (bool)(this->reversed_ ^ 1),failed,&ep,matches);
  if (bVar4) {
    if (*failed != false) {
      return false;
    }
    if (bVar3 == false) {
      if (local_38 == (StringPiece *)0x0) {
        return true;
      }
    }
    else {
      lVar7 = 0;
      if (this->reversed_ == false) {
        lVar7 = (long)text->length_;
      }
      pcVar6 = text->ptr_ + lVar7;
      pcVar2 = (char *)CONCAT44(ep._4_4_,(int)ep);
      if (local_38 == (StringPiece *)0x0) {
        return pcVar2 == pcVar6;
      }
      if (pcVar2 != pcVar6) {
        return pcVar2 == pcVar6;
      }
    }
    bVar4 = this->reversed_ == false;
    pSVar10 = (StringPiece *)&ep;
    if (bVar4) {
      pSVar10 = text;
    }
    pcVar2 = pSVar10->ptr_;
    iVar5 = *(int *)&text->ptr_ + text->length_;
    if (bVar4) {
      iVar5 = (int)ep;
    }
    local_38->ptr_ = pcVar2;
    local_38->length_ = iVar5 - (int)pcVar2;
    return true;
  }
  return false;
}

Assistant:

bool Prog::SearchDFA(const StringPiece& text, const StringPiece& const_context,
                     Anchor anchor, MatchKind kind,
                     StringPiece* match0, bool* failed, vector<int>* matches) {
  *failed = false;

  StringPiece context = const_context;
  if (context.begin() == NULL)
    context = text;
  bool carat = anchor_start();
  bool dollar = anchor_end();
  if (reversed_) {
    bool t = carat;
    carat = dollar;
    dollar = t;
  }
  if (carat && context.begin() != text.begin())
    return false;
  if (dollar && context.end() != text.end())
    return false;

  // Handle full match by running an anchored longest match
  // and then checking if it covers all of text.
  bool anchored = anchor == kAnchored || anchor_start() || kind == kFullMatch;
  bool endmatch = false;
  if (kind == kManyMatch) {
    endmatch = true;
  } else if (kind == kFullMatch || anchor_end()) {
    endmatch = true;
    kind = kLongestMatch;
  }

  // If the caller doesn't care where the match is (just whether one exists),
  // then we can stop at the very first match we find, the so-called
  // "shortest match".
  bool want_shortest_match = false;
  if (match0 == NULL && !endmatch) {
    want_shortest_match = true;
    kind = kLongestMatch;
  }

  DFA* dfa = GetDFA(kind);
  const char* ep;
  bool matched = dfa->Search(text, context, anchored,
                             want_shortest_match, !reversed_,
                             failed, &ep, matches);
  if (*failed)
    return false;
  if (!matched)
    return false;
  if (endmatch && ep != (reversed_ ? text.begin() : text.end()))
    return false;

  // If caller cares, record the boundary of the match.
  // We only know where it ends, so use the boundary of text
  // as the beginning.
  if (match0) {
    if (reversed_)
      match0->set(ep, static_cast<int>(text.end() - ep));
    else
      match0->set(text.begin(), static_cast<int>(ep - text.begin()));
  }
  return true;
}